

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugNames::NameIndex::dumpAbbreviations(NameIndex *this,ScopedPrinter *W)

{
  bool bVar1;
  Abbrev *this_00;
  const_iterator cVar2;
  const_iterator cVar3;
  Abbrev *Abbr;
  const_iterator __end1;
  undefined1 local_48 [8];
  const_iterator __begin1;
  DenseSet<llvm::DWARFDebugNames::Abbrev,_llvm::DWARFDebugNames::AbbrevMapInfo> *__range1;
  DelimitedScope<_[_,__]_> local_20;
  ListScope AbbrevsScope;
  ScopedPrinter *W_local;
  NameIndex *this_local;
  
  AbbrevsScope.W = W;
  StringRef::StringRef((StringRef *)&__range1,"Abbreviations");
  DelimitedScope<'[',_']'>::DelimitedScope(&local_20,W,___range1);
  __begin1.I.End = (pointer)this;
  cVar2 = detail::
          DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
          ::begin((DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                   *)this);
  __begin1.I.Ptr = cVar2.I.End;
  local_48 = (undefined1  [8])cVar2.I.Ptr;
  cVar3 = (const_iterator)
          detail::
          DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
          ::end((DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                 *)__begin1.I.End);
  while( true ) {
    __end1.I.Ptr = cVar3.End;
    Abbr = &(cVar3.Ptr)->key;
    bVar1 = detail::
            DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
            ::ConstIterator::operator!=((ConstIterator *)local_48,(ConstIterator *)&Abbr);
    if (!bVar1) break;
    this_00 = detail::
              DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
              ::ConstIterator::operator*((ConstIterator *)local_48);
    Abbrev::dump(this_00,AbbrevsScope.W);
    detail::
    DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
    ::ConstIterator::operator++((ConstIterator *)local_48);
    cVar3.End = __end1.I.Ptr;
    cVar3.Ptr = (pointer)Abbr;
  }
  DelimitedScope<'[',_']'>::~DelimitedScope(&local_20);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpAbbreviations(ScopedPrinter &W) const {
  ListScope AbbrevsScope(W, "Abbreviations");
  for (const auto &Abbr : Abbrevs)
    Abbr.dump(W);
}